

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_can_merge(char *file1,char *file2)

{
  int iVar1;
  mcpl_file_t ff;
  mcpl_file_t in_RSI;
  mcpl_file_t in_RDI;
  int can_merge;
  mcpl_file_t f2;
  mcpl_file_t f1;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  mcpl_open_file((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  ff = mcpl_open_file((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar1 = mcpl_actual_can_merge(in_RDI,in_RSI);
  mcpl_close_file(ff);
  mcpl_close_file(ff);
  return iVar1;
}

Assistant:

int mcpl_can_merge(const char * file1, const char* file2)
{
  mcpl_file_t f1 = mcpl_open_file(file1);
  mcpl_file_t f2 = mcpl_open_file(file2);
  int can_merge = mcpl_actual_can_merge(f1,f2);
  mcpl_close_file(f1);
  mcpl_close_file(f2);
  return can_merge;
}